

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

GCstr * lj_str_alloc(lua_State *L,char *str,MSize len,StrHash hash,int hashalg)

{
  char cVar1;
  StrID SVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  GCstr *pGVar6;
  uint64_t uVar7;
  uint64_t r;
  uintptr_t u;
  global_State *g;
  GCstr *s;
  int hashalg_local;
  StrHash hash_local;
  MSize len_local;
  char *str_local;
  lua_State *L_local;
  
  pGVar6 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,(ulong)(len + 4 & 0xfffffffc) + 0x18);
  uVar3 = (L->glref).ptr64;
  pGVar6->marked = *(byte *)(uVar3 + 0x20) & 3;
  pGVar6->gct = '\x04';
  pGVar6->len = len;
  pGVar6->hash = hash;
  cVar1 = *(char *)(uVar3 + 0xac);
  *(char *)(uVar3 + 0xac) = cVar1 + -1;
  if (cVar1 == '\0') {
    uVar7 = lj_prng_u64((PRNGState *)(uVar3 + 0x188));
    *(int *)(uVar3 + 0xa8) = (int)uVar7;
    *(char *)(uVar3 + 0xac) = (char)(uVar7 >> 0x38);
  }
  SVar2 = *(StrID *)(uVar3 + 0xa8);
  *(StrID *)(uVar3 + 0xa8) = SVar2 + 1;
  pGVar6->sid = SVar2;
  pGVar6->reserved = '\0';
  pGVar6->hashalg = (uint8_t)hashalg;
  *(undefined4 *)((long)&pGVar6[1].nextgc.gcptr64 + (ulong)(len & 0xfffffffc)) = 0;
  memcpy(pGVar6 + 1,str,(ulong)len);
  uVar5 = *(uint *)(uVar3 + 0xa0) & hash;
  uVar4 = *(ulong *)(*(long *)(uVar3 + 0x98) + (ulong)uVar5 * 8);
  (pGVar6->nextgc).gcptr64 = uVar4 & 0xfffffffffffffffe;
  *(ulong *)(*(long *)(uVar3 + 0x98) + (ulong)uVar5 * 8) = (ulong)pGVar6 | uVar4 & 1;
  uVar5 = *(uint *)(uVar3 + 0xa4);
  *(uint *)(uVar3 + 0xa4) = uVar5 + 1;
  if (*(uint *)(uVar3 + 0xa0) < uVar5) {
    lj_str_resize(L,*(int *)(uVar3 + 0xa0) * 2 + 1);
  }
  return pGVar6;
}

Assistant:

static GCstr *lj_str_alloc(lua_State *L, const char *str, MSize len,
			   StrHash hash, int hashalg)
{
  GCstr *s = lj_mem_newt(L, lj_str_size(len), GCstr);
  global_State *g = G(L);
  uintptr_t u;
  newwhite(g, s);
  s->gct = ~LJ_TSTR;
  s->len = len;
  s->hash = hash;
#ifndef STRID_RESEED_INTERVAL
  s->sid = g->str.id++;
#elif STRID_RESEED_INTERVAL
  if (!g->str.idreseed--) {
    uint64_t r = lj_prng_u64(&g->prng);
    g->str.id = (StrID)r;
    g->str.idreseed = (uint8_t)(r >> (64 - STRID_RESEED_INTERVAL));
  }
  s->sid = g->str.id++;
#else
  s->sid = (StrID)lj_prng_u64(&g->prng);
#endif
  s->reserved = 0;
  s->hashalg = (uint8_t)hashalg;
  /* Clear last 4 bytes of allocated memory. Implies zero-termination, too. */
  *(uint32_t *)(strdatawr(s)+(len & ~(MSize)3)) = 0;
  memcpy(strdatawr(s), str, len);
  /* Add to string hash table. */
  hash &= g->str.mask;
  u = gcrefu(g->str.tab[hash]);
  setgcrefp(s->nextgc, (u & ~(uintptr_t)1));
  /* NOBARRIER: The string table is a GC root. */
  setgcrefp(g->str.tab[hash], ((uintptr_t)s | (u & 1)));
  if (g->str.num++ > g->str.mask)  /* Allow a 100% load factor. */
    lj_str_resize(L, (g->str.mask<<1)+1);  /* Grow string table. */
  return s;  /* Return newly interned string. */
}